

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_complete(mbedtls_rsa_context *ctx)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint is_priv_00;
  int iVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool local_55;
  int is_priv;
  int is_pub;
  int d_missing;
  int pq_missing;
  int n_missing;
  int have_QP;
  int have_DQ;
  int have_DP;
  int have_E;
  int have_D;
  int have_Q;
  int have_P;
  int have_N;
  int ret;
  mbedtls_rsa_context *ctx_local;
  
  iVar5 = mbedtls_mpi_cmp_int(&ctx->N,0);
  bVar10 = iVar5 != 0;
  iVar5 = mbedtls_mpi_cmp_int(&ctx->P,0);
  bVar11 = iVar5 != 0;
  iVar5 = mbedtls_mpi_cmp_int(&ctx->Q,0);
  bVar12 = iVar5 != 0;
  iVar5 = mbedtls_mpi_cmp_int(&ctx->D,0);
  bVar13 = iVar5 != 0;
  iVar5 = mbedtls_mpi_cmp_int(&ctx->E,0);
  bVar14 = iVar5 != 0;
  iVar5 = mbedtls_mpi_cmp_int(&ctx->DP,0);
  iVar6 = mbedtls_mpi_cmp_int(&ctx->DQ,0);
  iVar7 = mbedtls_mpi_cmp_int(&ctx->QP,0);
  bVar1 = false;
  if (((bVar11) && (bVar1 = false, bVar12)) && (bVar1 = false, bVar13)) {
    bVar1 = bVar14;
  }
  bVar2 = false;
  if (((bVar10) && (bVar2 = false, !bVar11)) &&
     ((bVar2 = false, !bVar12 && (bVar2 = false, bVar13)))) {
    bVar2 = bVar14;
  }
  bVar3 = false;
  if (((bVar11) && (bVar3 = false, bVar12)) && (bVar3 = false, !bVar13)) {
    bVar3 = bVar14;
  }
  bVar4 = false;
  if ((((bVar10) && (bVar4 = false, !bVar11)) && (bVar4 = false, !bVar12)) &&
     (bVar4 = false, !bVar13)) {
    bVar4 = bVar14;
  }
  local_55 = true;
  if ((!bVar1) && (local_55 = true, !bVar2)) {
    local_55 = bVar3;
  }
  is_priv_00 = (uint)local_55;
  if ((is_priv_00 != 0) || (bVar4)) {
    if ((!bVar10) && ((bVar11 && (bVar12)))) {
      iVar8 = mbedtls_mpi_mul_mpi(&ctx->N,&ctx->P,&ctx->Q);
      if (iVar8 != 0) {
        return iVar8 + -0x4080;
      }
      sVar9 = mbedtls_mpi_size(&ctx->N);
      ctx->len = sVar9;
    }
    if (bVar2) {
      iVar8 = mbedtls_rsa_deduce_primes(&ctx->N,&ctx->E,&ctx->D,&ctx->P,&ctx->Q);
      if (iVar8 != 0) {
        return iVar8 + -0x4080;
      }
    }
    else if ((bVar3) &&
            (iVar8 = mbedtls_rsa_deduce_private_exponent(&ctx->P,&ctx->Q,&ctx->E,&ctx->D),
            iVar8 != 0)) {
      return iVar8 + -0x4080;
    }
    if ((is_priv_00 == 0) ||
       ((((iVar5 != 0 && (iVar6 != 0)) && (iVar7 != 0)) ||
        (iVar5 = mbedtls_rsa_deduce_crt(&ctx->P,&ctx->Q,&ctx->D,&ctx->DP,&ctx->DQ,&ctx->QP),
        iVar5 == 0)))) {
      ctx_local._4_4_ = rsa_check_context(ctx,is_priv_00,1);
    }
    else {
      ctx_local._4_4_ = iVar5 + -0x4080;
    }
  }
  else {
    ctx_local._4_4_ = -0x4080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_complete( mbedtls_rsa_context *ctx )
{
    int ret = 0;
    int have_N, have_P, have_Q, have_D, have_E;
#if !defined(MBEDTLS_RSA_NO_CRT)
    int have_DP, have_DQ, have_QP;
#endif
    int n_missing, pq_missing, d_missing, is_pub, is_priv;

    RSA_VALIDATE_RET( ctx != NULL );

    have_N = ( mbedtls_mpi_cmp_int( &ctx->N, 0 ) != 0 );
    have_P = ( mbedtls_mpi_cmp_int( &ctx->P, 0 ) != 0 );
    have_Q = ( mbedtls_mpi_cmp_int( &ctx->Q, 0 ) != 0 );
    have_D = ( mbedtls_mpi_cmp_int( &ctx->D, 0 ) != 0 );
    have_E = ( mbedtls_mpi_cmp_int( &ctx->E, 0 ) != 0 );

#if !defined(MBEDTLS_RSA_NO_CRT)
    have_DP = ( mbedtls_mpi_cmp_int( &ctx->DP, 0 ) != 0 );
    have_DQ = ( mbedtls_mpi_cmp_int( &ctx->DQ, 0 ) != 0 );
    have_QP = ( mbedtls_mpi_cmp_int( &ctx->QP, 0 ) != 0 );
#endif

    /*
     * Check whether provided parameters are enough
     * to deduce all others. The following incomplete
     * parameter sets for private keys are supported:
     *
     * (1) P, Q missing.
     * (2) D and potentially N missing.
     *
     */

    n_missing  =              have_P &&  have_Q &&  have_D && have_E;
    pq_missing =   have_N && !have_P && !have_Q &&  have_D && have_E;
    d_missing  =              have_P &&  have_Q && !have_D && have_E;
    is_pub     =   have_N && !have_P && !have_Q && !have_D && have_E;

    /* These three alternatives are mutually exclusive */
    is_priv = n_missing || pq_missing || d_missing;

    if( !is_priv && !is_pub )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * Step 1: Deduce N if P, Q are provided.
     */

    if( !have_N && have_P && have_Q )
    {
        if( ( ret = mbedtls_mpi_mul_mpi( &ctx->N, &ctx->P,
                                         &ctx->Q ) ) != 0 )
        {
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );
        }

        ctx->len = mbedtls_mpi_size( &ctx->N );
    }

    /*
     * Step 2: Deduce and verify all remaining core parameters.
     */

    if( pq_missing )
    {
        ret = mbedtls_rsa_deduce_primes( &ctx->N, &ctx->E, &ctx->D,
                                         &ctx->P, &ctx->Q );
        if( ret != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );

    }
    else if( d_missing )
    {
        if( ( ret = mbedtls_rsa_deduce_private_exponent( &ctx->P,
                                                         &ctx->Q,
                                                         &ctx->E,
                                                         &ctx->D ) ) != 0 )
        {
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );
        }
    }

    /*
     * Step 3: Deduce all additional parameters specific
     *         to our current RSA implementation.
     */

#if !defined(MBEDTLS_RSA_NO_CRT)
    if( is_priv && ! ( have_DP && have_DQ && have_QP ) )
    {
        ret = mbedtls_rsa_deduce_crt( &ctx->P,  &ctx->Q,  &ctx->D,
                                      &ctx->DP, &ctx->DQ, &ctx->QP );
        if( ret != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );
    }
#endif /* MBEDTLS_RSA_NO_CRT */

    /*
     * Step 3: Basic sanity checks
     */

    return( rsa_check_context( ctx, is_priv, 1 ) );
}